

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::write_decimal<unsigned__int128>
          (basic_writer<fmt::v6::buffer_range<wchar_t>_> *this,unsigned___int128 value)

{
  undefined1 auVar1 [16];
  undefined1 n [16];
  undefined1 value_00 [16];
  bool bVar2;
  checked_ptr<typename_buffer<wchar_t>::value_type> pwVar3;
  long in_RDX;
  wchar_t *in_RSI;
  basic_writer<fmt::v6::buffer_range<wchar_t>_> *in_RDI;
  checked_ptr<typename_buffer<wchar_t>::value_type> *it;
  int num_digits;
  bool negative;
  uint32_or_64_or_128_t<unsigned___int128> abs_value;
  size_t in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  checked_ptr<typename_buffer<wchar_t>::value_type> pwVar4;
  wchar_t *out;
  wchar_t *local_48;
  long local_40;
  
  auVar1._8_8_ = in_RDI;
  auVar1._0_8_ = in_stack_ffffffffffffff48;
  bVar2 = is_negative<unsigned___int128,_0>((unsigned___int128)auVar1);
  local_48 = in_RSI;
  local_40 = in_RDX;
  if (bVar2) {
    local_48 = (wchar_t *)-(long)in_RSI;
    local_40 = -(ulong)(in_RSI != (wchar_t *)0x0) - in_RDX;
  }
  n._8_4_ = in_stack_ffffffffffffff58;
  n._0_8_ = in_RDI;
  n._12_4_ = in_stack_ffffffffffffff5c;
  out = local_48;
  count_digits((uint128_t)n);
  pwVar3 = basic_writer<fmt::v6::buffer_range<wchar_t>_>::reserve(in_RDI,in_stack_ffffffffffffff48);
  pwVar4 = pwVar3;
  if (bVar2) {
    pwVar4 = pwVar3 + 1;
    *pwVar3 = L'-';
  }
  value_00._8_8_ = pwVar4;
  value_00._0_8_ = local_40;
  format_decimal<wchar_t,wchar_t*,unsigned__int128>
            (out,(unsigned___int128)value_00,(int)((ulong)local_48 >> 0x20));
  return;
}

Assistant:

void write_decimal(Int value) {
    auto abs_value = static_cast<uint32_or_64_or_128_t<Int>>(value);
    bool negative = is_negative(value);
    // Don't do -abs_value since it trips unsigned-integer-overflow sanitizer.
    if (negative) abs_value = ~abs_value + 1;
    int num_digits = count_digits(abs_value);
    auto&& it = reserve((negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (negative) *it++ = static_cast<char_type>('-');
    it = format_decimal<char_type>(it, abs_value, num_digits);
  }